

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

void mbedtls_x509_crt_free(mbedtls_x509_crt *crt)

{
  mbedtls_x509_crt **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_asn1_sequence *pmVar3;
  uchar *v;
  mbedtls_x509_crt *cert_cur;
  mbedtls_asn1_named_data *pmVar4;
  mbedtls_asn1_sequence *pmVar5;
  mbedtls_x509_crt *pmVar6;
  mbedtls_x509_crt *v_00;
  
  pmVar6 = crt;
  if (crt != (mbedtls_x509_crt *)0x0) {
    do {
      mbedtls_pk_free(&pmVar6->pk);
      free(pmVar6->sig_opts);
      pmVar4 = (pmVar6->issuer).next;
      while (pmVar4 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar4->next;
        mbedtls_zeroize(pmVar4,0x40);
        free(pmVar4);
        pmVar4 = pmVar2;
      }
      pmVar4 = (pmVar6->subject).next;
      while (pmVar4 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar4->next;
        mbedtls_zeroize(pmVar4,0x40);
        free(pmVar4);
        pmVar4 = pmVar2;
      }
      pmVar5 = (pmVar6->ext_key_usage).next;
      while (pmVar5 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar5->next;
        mbedtls_zeroize(pmVar5,0x20);
        free(pmVar5);
        pmVar5 = pmVar3;
      }
      pmVar5 = (pmVar6->subject_alt_names).next;
      while (pmVar5 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar5->next;
        mbedtls_zeroize(pmVar5,0x20);
        free(pmVar5);
        pmVar5 = pmVar3;
      }
      v = (pmVar6->raw).p;
      if (v != (uchar *)0x0) {
        mbedtls_zeroize(v,(pmVar6->raw).len);
        free((pmVar6->raw).p);
      }
      ppmVar1 = &pmVar6->next;
      pmVar6 = *ppmVar1;
      v_00 = crt;
    } while (*ppmVar1 != (mbedtls_x509_crt *)0x0);
    do {
      pmVar6 = v_00->next;
      mbedtls_zeroize(v_00,0x228);
      if (v_00 != crt) {
        free(v_00);
      }
      v_00 = pmVar6;
    } while (pmVar6 != (mbedtls_x509_crt *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crt_free( mbedtls_x509_crt *crt )
{
    mbedtls_x509_crt *cert_cur = crt;
    mbedtls_x509_crt *cert_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_sequence *seq_cur;
    mbedtls_x509_sequence *seq_prv;

    if( crt == NULL )
        return;

    do
    {
        mbedtls_pk_free( &cert_cur->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( cert_cur->sig_opts );
#endif

        name_cur = cert_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        name_cur = cert_cur->subject.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        seq_cur = cert_cur->ext_key_usage.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        seq_cur = cert_cur->subject_alt_names.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        if( cert_cur->raw.p != NULL )
        {
            mbedtls_zeroize( cert_cur->raw.p, cert_cur->raw.len );
            mbedtls_free( cert_cur->raw.p );
        }

        cert_cur = cert_cur->next;
    }
    while( cert_cur != NULL );

    cert_cur = crt;
    do
    {
        cert_prv = cert_cur;
        cert_cur = cert_cur->next;

        mbedtls_zeroize( cert_prv, sizeof( mbedtls_x509_crt ) );
        if( cert_prv != crt )
            mbedtls_free( cert_prv );
    }
    while( cert_cur != NULL );
}